

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_file.c
# Opt level: O0

ion_err_t ion_fwrite(ion_file_handle_t file,uint num_bytes,ion_byte_t *to_write)

{
  ion_byte_t *to_write_local;
  uint num_bytes_local;
  ion_file_handle_t file_local;
  
  fwrite(to_write,(ulong)num_bytes,1,(FILE *)file);
  return '\0';
}

Assistant:

ion_err_t
ion_fwrite(
	ion_file_handle_t	file,
	unsigned int		num_bytes,
	ion_byte_t			*to_write
) {
#if defined(ARDUINO)

	if (num_bytes != (fwrite(to_write, num_bytes, 1, file.file) * num_bytes)) {
		return err_file_write_error;
	}

	return err_ok;
#else
	fwrite(to_write, num_bytes, 1, file);
	return err_ok;
#endif
}